

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XDataAllocator.cpp
# Opt level: O2

void Memory::XDataAllocator::Unregister(XDataAllocation *xdataInfo)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  int *piVar4;
  undefined8 *in_FS_OFFSET;
  
  piVar4 = (int *)(xdataInfo->super_SecondaryAllocation).address;
  if (*piVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0xb3,"(ReadHead(xdataInfo->address))","ReadHead(xdataInfo->address)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    piVar4 = (int *)(xdataInfo->super_SecondaryAllocation).address;
  }
  __deregister_frame(piVar4);
  return;
}

Assistant:

void XDataAllocator::Unregister(XDataAllocation * xdataInfo)
{
#ifdef _WIN32
    if (!AutoSystemInfo::Data.IsWin8OrLater())
    {
        BOOLEAN success = RtlDeleteFunctionTable(&xdataInfo->pdata);
        Assert(success);
    }

#else  // !_WIN32
    Assert(ReadHead(xdataInfo->address));  // should be non-empty .eh_frame
    __DEREGISTER_FRAME(xdataInfo->address);
#endif
}